

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotations.h
# Opt level: O1

Pointer __thiscall
snestistics::AnnotationResolver::find_last_free_before_or_at
          (AnnotationResolver *this,Pointer p,Pointer stop)

{
  pointer pAVar1;
  bool bVar2;
  Pointer in_EAX;
  long lVar3;
  int i;
  long lVar4;
  
  if ((int)p < (int)stop) {
    return stop;
  }
  pAVar1 = (this->_annotations).
           super__Vector_base<snestistics::Annotation,_std::allocator<snestistics::Annotation>_>.
           _M_impl.super__Vector_impl_data._M_start;
  lVar4 = 0;
  do {
    if (p + (int)lVar4 < (uint)(this->_annotation_for_adress)._size) {
      lVar3 = (long)(this->_annotation_for_adress)._data[(int)p + lVar4];
      if (lVar3 == -1) {
        bVar2 = false;
      }
      else {
        bVar2 = false;
        if (pAVar1[lVar3].type - ANNOTATION_FUNCTION < 2) {
          bVar2 = true;
          if (lVar4 == 0) {
            in_EAX = 0xffffffff;
          }
          else {
            in_EAX = pAVar1[lVar3].endOfRange + 1;
          }
        }
      }
      if (bVar2) {
        return in_EAX;
      }
    }
    lVar3 = (int)p + lVar4;
    lVar4 = lVar4 + -1;
    if (lVar3 <= (int)stop) {
      return stop;
    }
  } while( true );
}

Assistant:

Pointer find_last_free_before_or_at(const Pointer p, const Pointer stop) const {
		// TODO: We could binary search annotations for stop instead to avoid linear search

		// Assume in same bank
		for (int i = p; i >= (int32_t)stop; i--) {
			if ((uint32_t)i >= _annotation_for_adress.size())
				continue;
			int ai = _annotation_for_adress[i];
			if (ai == -1)
				continue;
			const Annotation &a = _annotations[ai];
			if (a.type == ANNOTATION_FUNCTION || a.type == ANNOTATION_DATA) {
				if ((uint32_t)i == p)
					return INVALID_POINTER; // No valid
				return a.endOfRange+1;
			}
		}
		return stop;
	}